

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountedObject.cpp
# Opt level: O2

List * __thiscall
jbcoin::CountedObjects::getCounts_abi_cxx11_
          (List *__return_storage_ptr__,CountedObjects *this,int minimumThreshold)

{
  __pointer_type pCVar1;
  Entry entry;
  value_type local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::reserve(__return_storage_ptr__,(long)(this->m_count).super___atomic_base<int>._M_i);
  for (pCVar1 = (this->m_head)._M_b._M_p; pCVar1 != (__pointer_type)0x0; pCVar1 = pCVar1->m_next) {
    if (minimumThreshold <= (pCVar1->m_count).super___atomic_base<int>._M_i) {
      local_50.first._M_string_length = 0;
      local_50.first.field_2._M_local_buf[0] = '\0';
      local_50.second = 0;
      local_50.first._M_dataplus._M_p = (pointer)&local_50.first.field_2;
      (*pCVar1->_vptr_CounterBase[2])(pCVar1);
      std::__cxx11::string::assign((char *)&local_50);
      local_50.second = (pCVar1->m_count).super___atomic_base<int>._M_i;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::push_back(__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CountedObjects::List CountedObjects::getCounts (int minimumThreshold) const
{
    List counts;

    // When other operations are concurrent, the count
    // might be temporarily less than the actual count.
    int const count = m_count.load ();

    counts.reserve (count);

    CounterBase* counter = m_head.load ();

    while (counter != nullptr)
    {
        if (counter->getCount () >= minimumThreshold)
        {
            Entry entry;

            entry.first = counter->getName ();
            entry.second = counter->getCount ();

            counts.push_back (entry);
        }

        counter = counter->getNext ();
    }

    return counts;
}